

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

void __thiscall RefTable::Mark(RefTable *this,SQCollectable_conflict **chain)

{
  ulong uVar1;
  ulong uVar2;
  RefNode *o;
  
  uVar1 = this->_numofslots;
  if (uVar1 != 0) {
    o = this->_nodes;
    uVar2 = 0;
    do {
      if ((o->obj).super_SQObject._type != OT_NULL) {
        SQSharedState::MarkObject(&o->obj,chain);
        uVar1 = this->_numofslots;
      }
      o = o + 1;
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  return;
}

Assistant:

void RefTable::Mark(SQCollectable **chain)
{
    RefNode *nodes = (RefNode *)_nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        if(type(nodes->obj) != OT_NULL) {
            SQSharedState::MarkObject(nodes->obj,chain);
        }
        nodes++;
    }
}